

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1load.c
# Opt level: O2

void parse_subrs(T1_Face face,T1_Loader loader)

{
  PS_TableRec *pPVar1;
  FT_Memory pFVar2;
  undefined8 *puVar3;
  FT_Byte *pFVar4;
  ulong __n;
  FT_UInt FVar5;
  int iVar6;
  FT_Long FVar7;
  FT_Pointer __dest;
  FT_Hash hash;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  FT_Error error;
  FT_Memory local_60;
  uint local_54;
  ulong local_50;
  undefined8 *local_48;
  FT_Byte *base;
  FT_UInt local_38;
  undefined4 uStack_34;
  
  pFVar2 = (loader->parser).root.memory;
  puVar3 = (undefined8 *)face->psaux;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  pFVar4 = (loader->parser).root.cursor;
  if ((pFVar4 < (loader->parser).root.limit) && (*pFVar4 == '[')) {
    (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
    (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
    pFVar4 = (loader->parser).root.cursor;
    if ((pFVar4 < (loader->parser).root.limit) && (*pFVar4 == ']')) {
      return;
    }
LAB_00172ac1:
    (loader->parser).root.error = 3;
    return;
  }
  local_60 = pFVar2;
  local_48 = puVar3;
  local_50 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
  pFVar2 = local_60;
  if ((int)(uint)local_50 < 0) goto LAB_00172ac1;
  pFVar4 = (loader->parser).root.limit;
  if (((loader->parser).root.cursor <= pFVar4) &&
     (uVar10 = (long)pFVar4 - (long)(loader->parser).root.cursor >> 3,
     (long)uVar10 < (long)(ulong)((uint)local_50 & 0x7fffffff))) {
    if (loader->subrs_hash == (FT_Hash)0x0) {
      hash = (FT_Hash)ft_mem_alloc(local_60,0x28,&error);
      loader->subrs_hash = hash;
      if (error != 0) goto LAB_00172b55;
      error = ft_hash_num_init(hash,pFVar2);
      local_50 = uVar10 & 0xffffffff;
      if (error != 0) goto LAB_00172b55;
    }
    else {
      local_50 = uVar10 & 0xffffffff;
    }
  }
  (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
  if ((loader->parser).root.error != 0) {
    return;
  }
  pPVar1 = &loader->subrs;
  (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
  if ((loader->num_subrs != 0) ||
     (error = (**(code **)*local_48)(pPVar1,local_50,local_60), error == 0)) {
    uVar9 = 0;
    do {
      pFVar4 = (loader->parser).root.cursor;
      if (((((loader->parser).root.limit <= pFVar4 + 4) || (*pFVar4 != 'd')) || (pFVar4[1] != 'u'))
         || (pFVar4[2] != 'p')) {
        if (loader->num_subrs != 0) {
          return;
        }
        loader->num_subrs = (FT_Int)local_50;
        return;
      }
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      FVar7 = (*(loader->parser).root.funcs.to_int)((PS_Parser)loader);
      iVar6 = read_binary_data(&loader->parser,(FT_ULong *)&local_38,&base,
                               ((face->root).internal)->incremental_interface !=
                               (FT_Incremental_InterfaceRec *)0x0);
      if (iVar6 == 0) {
        return;
      }
      (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
      if ((loader->parser).root.error != 0) {
        return;
      }
      (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      pFVar4 = (loader->parser).root.cursor;
      if (((pFVar4 + 4 < (loader->parser).root.limit) && (*pFVar4 == 'p')) &&
         ((pFVar4[1] == 'u' && (pFVar4[2] == 't')))) {
        (*(loader->parser).root.funcs.skip_PS_token)((PS_Parser)loader);
        (*(loader->parser).root.funcs.skip_spaces)((PS_Parser)loader);
      }
      local_54 = uVar9;
      uVar8 = (uint)FVar7;
      if (loader->subrs_hash != (FT_Hash)0x0) {
        ft_hash_num_insert((uint)FVar7,(ulong)uVar9,loader->subrs_hash,local_60);
        uVar8 = uVar9;
      }
      FVar5 = local_38;
      if (loader->num_subrs == 0) {
        uVar10 = (ulong)(face->type1).private_dict.lenIV;
        if ((long)uVar10 < 0) {
          error = (*(loader->subrs).funcs.add)(pPVar1,uVar8,base,local_38);
        }
        else {
          __n = CONCAT44(uStack_34,local_38);
          if (__n < uVar10) {
            error = 3;
            break;
          }
          __dest = ft_mem_alloc(local_60,__n,&error);
          if (error != 0) break;
          memcpy(__dest,base,__n);
          (*(code *)local_48[4])(__dest,__n,0x10ea);
          iVar6 = (face->type1).private_dict.lenIV;
          error = (*(loader->subrs).funcs.add)
                            (pPVar1,uVar8,(void *)((long)__dest + (long)iVar6),FVar5 - iVar6);
          ft_mem_free(local_60,__dest);
        }
        if (error != 0) break;
      }
      uVar9 = local_54 + 1;
    } while( true );
  }
LAB_00172b55:
  (loader->parser).root.error = error;
  return;
}

Assistant:

static void
  parse_subrs( T1_Face    face,
               T1_Loader  loader )
  {
    T1_Parser  parser = &loader->parser;
    PS_Table   table  = &loader->subrs;
    FT_Memory  memory = parser->root.memory;
    FT_Error   error;
    FT_Int     num_subrs;
    FT_UInt    count;

    PSAux_Service  psaux = (PSAux_Service)face->psaux;


    T1_Skip_Spaces( parser );

    /* test for empty array */
    if ( parser->root.cursor < parser->root.limit &&
         *parser->root.cursor == '['              )
    {
      T1_Skip_PS_Token( parser );
      T1_Skip_Spaces  ( parser );
      if ( parser->root.cursor >= parser->root.limit ||
           *parser->root.cursor != ']'               )
        parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    num_subrs = (FT_Int)T1_ToInt( parser );
    if ( num_subrs < 0 )
    {
      parser->root.error = FT_THROW( Invalid_File_Format );
      return;
    }

    /* we certainly need more than 8 bytes per subroutine */
    if ( parser->root.limit >= parser->root.cursor                     &&
         num_subrs > ( parser->root.limit - parser->root.cursor ) >> 3 )
    {
      /*
       * There are two possibilities.  Either the font contains an invalid
       * value for `num_subrs', or we have a subsetted font where the
       * subroutine indices are not adjusted, e.g.
       *
       *   /Subrs 812 array
       *     dup 0 { ... } NP
       *     dup 51 { ... } NP
       *     dup 681 { ... } NP
       *   ND
       *
       * In both cases, we use a number hash that maps from subr indices to
       * actual array elements.
       */

      FT_TRACE0(( "parse_subrs: adjusting number of subroutines"
                  " (from %d to %d)\n",
                  num_subrs,
                  ( parser->root.limit - parser->root.cursor ) >> 3 ));
      num_subrs = ( parser->root.limit - parser->root.cursor ) >> 3;

      if ( !loader->subrs_hash )
      {
        if ( FT_NEW( loader->subrs_hash ) )
          goto Fail;

        error = ft_hash_num_init( loader->subrs_hash, memory );
        if ( error )
          goto Fail;
      }
    }

    /* position the parser right before the `dup' of the first subr */
    T1_Skip_PS_Token( parser );         /* `array' */
    if ( parser->root.error )
      return;
    T1_Skip_Spaces( parser );

    /* initialize subrs array -- with synthetic fonts it is possible */
    /* we get here twice                                             */
    if ( !loader->num_subrs )
    {
      error = psaux->ps_table_funcs->init( table, num_subrs, memory );
      if ( error )
        goto Fail;
    }

    /* the format is simple:   */
    /*                         */
    /*   `index' + binary data */
    /*                         */
    for ( count = 0; ; count++ )
    {
      FT_Long   idx;
      FT_ULong  size;
      FT_Byte*  base;


      /* If we are out of data, or if the next token isn't `dup', */
      /* we are done.                                             */
      if ( parser->root.cursor + 4 >= parser->root.limit          ||
          ft_strncmp( (char*)parser->root.cursor, "dup", 3 ) != 0 )
        break;

      T1_Skip_PS_Token( parser );       /* `dup' */

      idx = T1_ToInt( parser );

      if ( !read_binary_data( parser, &size, &base, IS_INCREMENTAL ) )
        return;

      /* The binary string is followed by one token, e.g. `NP' */
      /* (bound to `noaccess put') or by two separate tokens:  */
      /* `noaccess' & `put'.  We position the parser right     */
      /* before the next `dup', if any.                        */
      T1_Skip_PS_Token( parser );   /* `NP' or `|' or `noaccess' */
      if ( parser->root.error )
        return;
      T1_Skip_Spaces  ( parser );

      if ( parser->root.cursor + 4 < parser->root.limit            &&
           ft_strncmp( (char*)parser->root.cursor, "put", 3 ) == 0 )
      {
        T1_Skip_PS_Token( parser ); /* skip `put' */
        T1_Skip_Spaces  ( parser );
      }

      /* if we use a hash, the subrs index is the key, and a running */
      /* counter specified for `T1_Add_Table' acts as the value      */
      if ( loader->subrs_hash )
      {
        ft_hash_num_insert( idx, count, loader->subrs_hash, memory );
        idx = count;
      }

      /* with synthetic fonts it is possible we get here twice */
      if ( loader->num_subrs )
        continue;

      /* some fonts use a value of -1 for lenIV to indicate that */
      /* the charstrings are unencoded                           */
      /*                                                         */
      /* thanks to Tom Kacvinsky for pointing this out           */
      /*                                                         */
      if ( face->type1.private_dict.lenIV >= 0 )
      {
        FT_Byte*  temp = NULL;


        /* some fonts define empty subr records -- this is not totally */
        /* compliant to the specification (which says they should at   */
        /* least contain a `return'), but we support them anyway       */
        if ( size < (FT_ULong)face->type1.private_dict.lenIV )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Fail;
        }

        /* t1_decrypt() shouldn't write to base -- make temporary copy */
        if ( FT_ALLOC( temp, size ) )
          goto Fail;
        FT_MEM_COPY( temp, base, size );
        psaux->t1_decrypt( temp, size, 4330 );
        size -= (FT_ULong)face->type1.private_dict.lenIV;
        error = T1_Add_Table( table, (FT_Int)idx,
                              temp + face->type1.private_dict.lenIV, size );
        FT_FREE( temp );
      }
      else
        error = T1_Add_Table( table, (FT_Int)idx, base, size );
      if ( error )
        goto Fail;
    }

    if ( !loader->num_subrs )
      loader->num_subrs = num_subrs;

    return;

  Fail:
    parser->root.error = error;
  }